

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O3

void absl::lts_20250127::crc_internal::CrcCordState::Unref(RefcountedRep *r)

{
  if (r == (RefcountedRep *)0x0) {
    __assert_fail("r != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/crc/internal/crc_cord_state.h"
                  ,0x92,"static void absl::crc_internal::CrcCordState::Unref(RefcountedRep *)");
  }
  LOCK();
  (r->count).super___atomic_base<int>._M_i = (r->count).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((r->count).super___atomic_base<int>._M_i == 0) {
    std::
    _Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ::~_Deque_base(&(r->rep).prefix_crc.
                    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                  );
    operator_delete(r,0x68);
    return;
  }
  return;
}

Assistant:

static void Unref(RefcountedRep* r) {
    assert(r != nullptr);
    if (r->count.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      delete r;
    }
  }